

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O3

void __thiscall bloaty::ReadEhFrame(bloaty *this,string_view data,RangeSink *sink)

{
  byte bVar1;
  uint8_t uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint64_t label_from_vmaddr;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  __hash_code __code;
  _Hash_node_base *p_Var8;
  _Hash_node_base _Var9;
  RangeSink *sink_00;
  uint *puVar10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  bloaty *pbVar13;
  size_t sVar14;
  pointer __ptr_1;
  undefined1 auVar15 [16];
  string_view sVar16;
  string_view entry;
  __buckets_alloc_type __alloc;
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  cie_map;
  CompilationUnitSizes sizes;
  string_view local_b0;
  new_allocator<std::__detail::_Hash_node_base_*> local_99;
  char *local_98;
  _Hash_node_base **local_90;
  ulong local_88;
  _Hash_node_base local_80;
  ulong uStack_78;
  undefined4 local_70 [2];
  undefined8 local_68;
  _Hash_node_base *p_Stack_60;
  string_view local_58;
  undefined8 local_48;
  RangeSink *local_40;
  CompilationUnitSizes local_34;
  
  sink_00 = (RangeSink *)data._M_str;
  local_58._M_str = (char *)data._M_len;
  local_90 = &p_Stack_60;
  local_88 = 1;
  local_80._M_nxt = (_Hash_node_base *)0x0;
  uStack_78 = 0;
  local_70[0] = 0x3f800000;
  local_68 = 0;
  p_Stack_60 = (_Hash_node_base *)0x0;
  _Var9._M_nxt = local_80._M_nxt;
  local_58._M_len = (size_t)this;
  if (this != (bloaty *)0x0) {
    local_98 = "Unexpected eh_frame CIE version";
    local_40 = sink_00;
    do {
      pcVar3 = local_58._M_str;
      sVar14 = local_58._M_len;
      local_b0 = dwarf::CompilationUnitSizes::ReadInitialLength(&local_34,&local_58);
      puVar10 = (uint *)local_b0._M_str;
      uVar11 = local_b0._M_len;
      _Var9._M_nxt = local_80._M_nxt;
      if (uVar11 == 0 && (bloaty *)local_58._M_len == (bloaty *)0x0) break;
      pbVar13 = (bloaty *)((uVar11 - (long)pcVar3) + (long)puVar10);
      if (sVar14 < pbVar13) {
        pbVar13 = (bloaty *)sVar14;
      }
      if (uVar11 < 4) {
        Throw("premature EOF reading fixed-length data",0x8d);
      }
      sVar14 = uVar11 - 4;
      local_b0._M_str = (char *)(puVar10 + 1);
      local_b0._M_len = sVar14;
      if ((ulong)*puVar10 == 0) {
        uVar11 = (ulong)pcVar3 % local_88;
        if (local_90[uVar11] != (_Hash_node_base *)0x0) {
          p_Var8 = local_90[uVar11]->_M_nxt;
          p_Var7 = p_Var8[1]._M_nxt;
          do {
            if (p_Var7 == (_Hash_node_base *)pcVar3) goto LAB_001bae0c;
            p_Var8 = p_Var8->_M_nxt;
          } while ((p_Var8 != (_Hash_node_base *)0x0) &&
                  (p_Var7 = p_Var8[1]._M_nxt, (ulong)p_Var7 % local_88 == uVar11));
        }
        p_Var8 = (_Hash_node_base *)operator_new(0x30);
        p_Var8->_M_nxt = (_Hash_node_base *)0x0;
        p_Var8[1]._M_nxt = (_Hash_node_base *)pcVar3;
        p_Var8[2]._M_nxt = (_Hash_node_base *)0x0;
        p_Var8[3]._M_nxt = (_Hash_node_base *)0x0;
        p_Var8[4]._M_nxt = (_Hash_node_base *)0x0;
        p_Var8[5]._M_nxt = (_Hash_node_base *)0x0;
        local_48 = local_68;
        auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)local_70,local_88,uStack_78);
        __n = auVar15._8_8_;
        if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__n == 1) {
            p_Stack_60 = (_Hash_node_base *)0x0;
            __s = &p_Stack_60;
          }
          else {
            __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                            (&local_99,__n,(void *)0x0);
            memset(__s,0,__n * 8);
          }
          _Var9._M_nxt = local_80._M_nxt;
          local_80._M_nxt = (_Hash_node_base *)0x0;
          if (_Var9._M_nxt != (_Hash_node_base *)0x0) {
            uVar11 = 0;
            do {
              p_Var7 = (_Var9._M_nxt)->_M_nxt;
              uVar12 = (ulong)_Var9._M_nxt[1]._M_nxt % __n;
              if (__s[uVar12] == (_Hash_node_base *)0x0) {
                (_Var9._M_nxt)->_M_nxt = local_80._M_nxt;
                __s[uVar12] = &local_80;
                local_80._M_nxt = _Var9._M_nxt;
                if ((_Var9._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                  p_Var6 = (_Hash_node_base *)(__s + uVar11);
                  goto LAB_001bad6a;
                }
              }
              else {
                (_Var9._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
                p_Var6 = __s[uVar12];
                uVar12 = uVar11;
LAB_001bad6a:
                p_Var6->_M_nxt = _Var9._M_nxt;
              }
              _Var9._M_nxt = p_Var7;
              uVar11 = uVar12;
            } while (p_Var7 != (_Hash_node_base *)0x0);
          }
          if (&p_Stack_60 != local_90) {
            operator_delete(local_90,local_88 << 3);
          }
          uVar11 = (ulong)pcVar3 % __n;
          local_90 = __s;
          local_88 = __n;
        }
        sink_00 = local_40;
        if (local_90[uVar11] == (_Hash_node_base *)0x0) {
          p_Var8->_M_nxt = local_80._M_nxt;
          if (local_80._M_nxt != (_Hash_node_base *)0x0) {
            local_90[(ulong)local_80._M_nxt[1]._M_nxt % local_88] = p_Var8;
          }
          local_90[uVar11] = &local_80;
          local_80._M_nxt = p_Var8;
        }
        else {
          p_Var8->_M_nxt = local_90[uVar11]->_M_nxt;
          local_90[uVar11]->_M_nxt = p_Var8;
        }
        uStack_78 = uStack_78 + 1;
        sVar14 = local_b0._M_len;
LAB_001bae0c:
        if (sVar14 == 0) {
          Throw("premature EOF reading fixed-length data",0x8d);
        }
        bVar1 = *local_b0._M_str;
        local_b0._M_str = local_b0._M_str + 1;
        local_b0._M_len = sVar14 - 1;
        *(uint *)&p_Var8[2]._M_nxt = (uint)bVar1;
        sVar16 = ReadUntilConsuming(&local_b0,'\0');
        uVar4 = dwarf::ReadLEB128<unsigned_int>(&local_b0);
        *(uint *)((long)&p_Var8[2]._M_nxt + 4) = uVar4;
        iVar5 = dwarf::ReadLEB128<int>(&local_b0);
        *(int *)&p_Var8[3]._M_nxt = iVar5;
        if (*(int *)&p_Var8[2]._M_nxt == 1) {
          if (local_b0._M_len == 0) {
LAB_001bb035:
            iVar5 = 0x8d;
            local_98 = "premature EOF reading fixed-length data";
            goto LAB_001bb04f;
          }
          uVar4 = (uint)(byte)*local_b0._M_str;
          local_b0._M_str = local_b0._M_str + 1;
          local_b0._M_len = local_b0._M_len - 1;
        }
        else {
          if (*(int *)&p_Var8[2]._M_nxt != 3) {
            iVar5 = 0xa8;
LAB_001bb04f:
            Throw(local_98,iVar5);
          }
          uVar4 = dwarf::ReadLEB128<unsigned_int>(&local_b0);
        }
        *(uint *)&p_Var8[5]._M_nxt = uVar4;
        if (sVar16._M_len != 0) {
          sVar14 = 0;
          do {
            iVar5 = 0xc1;
            switch(sVar16._M_str[sVar14]) {
            case 'L':
              if (local_b0._M_len == 0) goto LAB_001bb035;
              uVar2 = *local_b0._M_str;
              local_b0._M_str = local_b0._M_str + 1;
              local_b0._M_len = local_b0._M_len - 1;
              *(uint8_t *)((long)&p_Var8[3]._M_nxt + 5) = uVar2;
              break;
            case 'M':
            case 'N':
            case 'O':
            case 'Q':
switchD_001baec9_caseD_4d:
              local_98 = "Unexepcted augmentation character";
              goto LAB_001bb04f;
            case 'P':
              if (local_b0._M_len == 0) {
                Throw("premature EOF reading fixed-length data",0x8d);
              }
              uVar2 = *local_b0._M_str;
              local_b0._M_str = local_b0._M_str + 1;
              local_b0._M_len = local_b0._M_len - 1;
              p_Var7 = (_Hash_node_base *)
                       ReadEncodedPointer(uVar2,true,&local_b0,(char *)0x0,sink_00);
              p_Var8[4]._M_nxt = p_Var7;
              break;
            case 'R':
              if (local_b0._M_len == 0) goto LAB_001bb035;
              uVar2 = *local_b0._M_str;
              local_b0._M_str = local_b0._M_str + 1;
              local_b0._M_len = local_b0._M_len - 1;
              *(uint8_t *)((long)&p_Var8[3]._M_nxt + 4) = uVar2;
              break;
            case 'S':
              *(undefined1 *)((long)&p_Var8[3]._M_nxt + 6) = 1;
              break;
            default:
              if (sVar16._M_str[sVar14] != 'z') goto switchD_001baec9_caseD_4d;
              *(undefined1 *)((long)&p_Var8[3]._M_nxt + 7) = 1;
              dwarf::ReadLEB128<unsigned_int>(&local_b0);
            }
            sVar14 = sVar14 + 1;
          } while (sVar16._M_len != sVar14);
        }
      }
      else {
        p_Var8 = (_Hash_node_base *)((long)(puVar10 + 1) + (-4 - (ulong)*puVar10));
        uVar11 = (ulong)p_Var8 % local_88;
        if (local_90[uVar11] == (_Hash_node_base *)0x0) {
LAB_001bb024:
          Throw("Couldn\'t find CIE for FDE",200);
        }
        p_Var7 = local_90[uVar11]->_M_nxt;
        p_Var6 = p_Var7[1]._M_nxt;
        while (p_Var6 != p_Var8) {
          p_Var7 = p_Var7->_M_nxt;
          if ((p_Var7 == (_Hash_node_base *)0x0) ||
             (p_Var6 = p_Var7[1]._M_nxt, (ulong)p_Var6 % local_88 != uVar11)) goto LAB_001bb024;
        }
        label_from_vmaddr =
             ReadEncodedPointer(*(uint8_t *)((long)&p_Var7[3]._M_nxt + 4),true,&local_b0,(char *)0x0
                                ,sink_00);
        sVar16._M_str = pcVar3;
        sVar16._M_len = (size_t)pbVar13;
        RangeSink::AddFileRangeForVMAddr(sink_00,"dwarf_fde",label_from_vmaddr,sVar16);
      }
      _Var9._M_nxt = local_80._M_nxt;
    } while ((bloaty *)local_58._M_len != (bloaty *)0x0);
  }
  while (_Var9._M_nxt != (_Hash_node_base *)0x0) {
    p_Var8 = (_Var9._M_nxt)->_M_nxt;
    operator_delete(_Var9._M_nxt,0x30);
    _Var9._M_nxt = p_Var8;
  }
  memset(local_90,0,local_88 << 3);
  local_80._M_nxt = (_Hash_node_base *)0x0;
  uStack_78 = 0;
  if (&p_Stack_60 != local_90) {
    operator_delete(local_90,local_88 << 3);
  }
  return;
}

Assistant:

void ReadEhFrame(string_view data, RangeSink* sink) {
  string_view remaining = data;

  struct CIEInfo {
    int version = 0;
    uint32_t code_align = 0;
    int32_t data_align = 0;
    uint8_t fde_encoding = 0;
    uint8_t lsda_encoding = 0;
    bool is_signal_handler = false;
    bool has_augmentation_length = false;
    uint64_t personality_function = 0;
    uint32_t return_address_reg = 0;
  };

  std::unordered_map<const void*, CIEInfo> cie_map;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_entry = remaining;
    string_view entry = sizes.ReadInitialLength(&remaining);
    if (entry.size() == 0 && remaining.size() == 0) {
      return;
    }
    full_entry =
        full_entry.substr(0, entry.size() + (entry.data() - full_entry.data()));
    uint32_t id = ReadFixed<uint32_t>(&entry);
    if (id == 0) {
      // CIE, we don't attribute this yet.
      CIEInfo& cie_info = cie_map[full_entry.data()];
      cie_info.version = ReadFixed<uint8_t>(&entry);
      string_view aug_string = ReadNullTerminated(&entry);
      cie_info.code_align = dwarf::ReadLEB128<uint32_t>(&entry);
      cie_info.data_align = dwarf::ReadLEB128<int32_t>(&entry);
      switch (cie_info.version) {
        case 1:
          cie_info.return_address_reg = ReadFixed<uint8_t>(&entry);
          break;
        case 3:
          cie_info.return_address_reg = dwarf::ReadLEB128<uint32_t>(&entry);
          break;
        default:
          THROW("Unexpected eh_frame CIE version");
      }
      while (aug_string.size() > 0) {
        switch (aug_string[0]) {
          case 'z':
            // Length until the end of augmentation data.
            cie_info.has_augmentation_length = true;
            dwarf::ReadLEB128<uint32_t>(&entry);
            break;
          case 'L':
            cie_info.lsda_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'R':
            cie_info.fde_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'S':
            cie_info.is_signal_handler = true;
            break;
          case 'P': {
            uint8_t encoding = ReadFixed<uint8_t>(&entry);
            cie_info.personality_function =
                ReadEncodedPointer(encoding, true, &entry, nullptr, sink);
            break;
          }
          default:
            THROW("Unexepcted augmentation character");
        }
        aug_string.remove_prefix(1);
      }
    } else {
      auto iter = cie_map.find(entry.data() - id - 4);
      if (iter == cie_map.end()) {
        THROW("Couldn't find CIE for FDE");
      }
      const CIEInfo& cie_info = iter->second;
      // TODO(haberman): don't hard-code 64-bit.
      uint64_t address = ReadEncodedPointer(cie_info.fde_encoding, true, &entry,
                                            nullptr, sink);
      // TODO(haberman); Technically the FDE addresses could span a
      // function/compilation unit?  They can certainly span inlines.
      /*
      uint64_t length =
        ReadEncodedPointer(cie_info.fde_encoding & 0xf, true, &entry, sink);
      (void)length;

      if (cie_info.has_augmentation_length) {
        uint32_t augmentation_length = dwarf::ReadLEB128<uint32_t>(&entry);
        (void)augmentation_length;
      }

      uint64_t lsda =
          ReadEncodedPointer(cie_info.lsda_encoding, true, &entry, sink);
      if (lsda) {
      }
      */

      sink->AddFileRangeForVMAddr("dwarf_fde", address, full_entry);
    }
  }
}